

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O3

uint64_t Imf_3_2::anon_unknown_0::memstream_read
                   (exr_const_context_t f,void *userdata,void *buffer,uint64_t sz,uint64_t offset,
                   exr_stream_error_func_ptr_t errcb)

{
  ulong uVar1;
  
  if (((userdata == (void *)0x0) ||
      ((((uVar1 = *(ulong *)((long)userdata + 8), uVar1 < sz + offset || (uVar1 < offset)) ||
        (uVar1 < sz)) && (sz = uVar1 - offset, uVar1 < offset || sz == 0)))) || ((long)sz < 1)) {
    sz = 0;
  }
  else {
    memcpy(buffer,(void *)(offset + *userdata),sz);
  }
  return sz;
}

Assistant:

static uint64_t
memstream_read (
    exr_const_context_t         f,
    void*                       userdata,
    void*                       buffer,
    uint64_t                    sz,
    uint64_t                    offset,
    exr_stream_error_func_ptr_t errcb)
{
    int64_t rdsz = 0;
    if (userdata)
    {
        memdata* md   = static_cast<memdata*> (userdata);
        int64_t left = sz;
        if (offset > md->bytes ||  sz > md->bytes || offset+sz > md->bytes)
            left = (offset < md->bytes) ? md->bytes - offset : 0;
        if (left > 0)
        {
            memcpy (buffer, md->data + offset, left);
            rdsz = left;
        }
    }

    return rdsz;
}